

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

void R_DeinitTranslationTables(void)

{
  FRemapTable *this;
  uint j;
  ulong uVar1;
  int i;
  long lVar2;
  TArray<FRemapTablePtr,_FRemapTable_*> *this_00;
  
  for (lVar2 = 0; lVar2 != 0xb; lVar2 = lVar2 + 1) {
    this_00 = &translationtables[lVar2].super_TArray<FRemapTablePtr,_FRemapTable_*>;
    for (uVar1 = 0;
        uVar1 < translationtables[lVar2].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count;
        uVar1 = uVar1 + 1) {
      this = this_00->Array[uVar1].Ptr;
      if (this != (FRemapTable *)0x0) {
        FRemapTable::~FRemapTable(this);
        operator_delete(this,0x20);
        this_00->Array[uVar1].Ptr = (FRemapTable *)0x0;
      }
    }
    TArray<FRemapTablePtr,_FRemapTable_*>::Clear(this_00);
  }
  TArray<PalEntry,_PalEntry>::Clear(&BloodTranslationColors);
  return;
}

Assistant:

void R_DeinitTranslationTables()
{
	for (int i = 0; i < NUM_TRANSLATION_TABLES; ++i)
	{
		for (unsigned int j = 0; j < translationtables[i].Size(); ++j)
		{
			if (translationtables[i][j] != NULL)
			{
				delete translationtables[i][j];
				translationtables[i][j] = NULL;
			}
		}
		translationtables[i].Clear();
	}
	BloodTranslationColors.Clear();
}